

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cc
# Opt level: O0

void __thiscall cnn::Device_CPU::Device_CPU(Device_CPU *this,int mb,bool shared)

{
  void *pvVar1;
  undefined8 uVar2;
  AlignedMemoryPool *this_00;
  MemAllocator *a;
  byte in_DL;
  undefined8 *in_RDI;
  DeviceType in_stack_ffffffffffffff8c;
  Device *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  
  *in_RDI = &PTR__Device_CPU_008fbe58;
  Device::Device(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(MemAllocator *)0x5d72c5);
  *in_RDI = &PTR__Device_CPU_008fbe58;
  CPUAllocator::CPUAllocator((CPUAllocator *)in_stack_ffffffffffffff90);
  in_RDI[0xf] = in_RDI[2];
  if ((in_DL & 1) != 0) {
    pvVar1 = operator_new(0x10);
    SharedAllocator::SharedAllocator((SharedAllocator *)in_stack_ffffffffffffff90);
    in_RDI[0xf] = pvVar1;
  }
  uVar2 = (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],4);
  in_RDI[6] = uVar2;
  *(undefined4 *)in_RDI[6] = 0xbf800000;
  uVar2 = (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],4);
  in_RDI[7] = uVar2;
  *(undefined4 *)in_RDI[7] = 0x3f800000;
  uVar2 = (**(code **)(*(long *)in_RDI[2] + 0x10))((long *)in_RDI[2],4);
  in_RDI[8] = uVar2;
  *(undefined4 *)in_RDI[8] = 0;
  this_00 = (AlignedMemoryPool *)operator_new(0x28);
  AlignedMemoryPool::AlignedMemoryPool
            (this_00,in_stack_ffffffffffffff98,(MemAllocator *)in_stack_ffffffffffffff90);
  in_RDI[3] = this_00;
  pvVar1 = operator_new(0x28);
  AlignedMemoryPool::AlignedMemoryPool
            (this_00,(size_t)pvVar1,(MemAllocator *)in_stack_ffffffffffffff90);
  in_RDI[4] = pvVar1;
  a = (MemAllocator *)operator_new(0x28);
  AlignedMemoryPool::AlignedMemoryPool(this_00,(size_t)pvVar1,a);
  in_RDI[5] = a;
  return;
}

Assistant:

Device_CPU::Device_CPU(int mb, bool shared) :
    Device(DeviceType::CPU, &cpu_mem), shmem(mem) {
  if (shared) shmem = new SharedAllocator();
  kSCALAR_MINUSONE = (float*) mem->malloc(sizeof(float));
  *kSCALAR_MINUSONE = -1;
  kSCALAR_ONE = (float*) mem->malloc(sizeof(float));
  *kSCALAR_ONE = 1;
  kSCALAR_ZERO = (float*) mem->malloc(sizeof(float));
  *kSCALAR_ZERO = 0;

  // this is the big memory allocation: the pools
  fxs = new AlignedMemoryPool(mb << 20, mem); // memory for node values
  dEdfs = new AlignedMemoryPool(mb << 20, mem); // memory for node gradients
  ps = new AlignedMemoryPool(mb << 20, shmem); // memory for parameters
}